

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O0

__int128 * __thiscall
calculator::ExpressionParser<__int128>::parseValue(ExpressionParser<__int128> *this)

{
  char cVar1;
  bool bVar2;
  string *psVar3;
  undefined8 uVar4;
  ExpressionParser<__int128> *this_00;
  error *in_RDI;
  ExpressionParser<__int128> *in_stack_00000008;
  ExpressionParser<__int128> *in_stack_000000b0;
  __int128 val;
  ExpressionParser<__int128> *in_stack_fffffffffffffea8;
  ExpressionParser<__int128> *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  error *in_stack_fffffffffffffed0;
  ExpressionParser<__int128> *in_stack_fffffffffffffed8;
  error *__a;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 uVar5;
  _Alloc_hider in_stack_fffffffffffffef7;
  __int128 *local_38;
  ExpressionParser<__int128> *in_stack_ffffffffffffffd8;
  
  eatSpaces(in_stack_fffffffffffffeb0);
  cVar1 = getCharacter(in_stack_fffffffffffffea8);
  this_00 = (ExpressionParser<__int128> *)(ulong)((int)cVar1 - 0x28);
  switch(this_00) {
  case (ExpressionParser<__int128> *)0x0:
    (in_RDI->expr_).field_2._M_allocated_capacity =
         (in_RDI->expr_).field_2._M_allocated_capacity + 1;
    local_38 = parseExpr(in_stack_00000008);
    eatSpaces(in_stack_fffffffffffffeb0);
    cVar1 = getCharacter(in_stack_fffffffffffffea8);
    if (cVar1 != ')') {
      bVar2 = isEnd(in_stack_fffffffffffffeb0);
      if (!bVar2) {
        unexpected(in_stack_000000b0);
      }
      psVar3 = (string *)__cxa_allocate_exception(0x30);
      __a = in_RDI;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffef7,
                          CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)),
                 (char *)this_00,(allocator<char> *)__a);
      error::error(in_RDI,psVar3,in_stack_fffffffffffffec0);
      __cxa_throw(psVar3,&error::typeinfo,error::~error);
    }
    (in_RDI->expr_).field_2._M_allocated_capacity =
         (in_RDI->expr_).field_2._M_allocated_capacity + 1;
    break;
  default:
    bVar2 = isEnd(in_stack_fffffffffffffeb0);
    if (!bVar2) {
      unexpected(in_stack_000000b0);
    }
    uVar5 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    psVar3 = (string *)&stack0xfffffffffffffef7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffef7,CONCAT16(uVar5,in_stack_fffffffffffffef0)),
               (char *)this_00,(allocator<char> *)in_RDI);
    error::error(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,psVar3);
    __cxa_throw(uVar4,&error::typeinfo,error::~error);
  case (ExpressionParser<__int128> *)0x3:
    (in_RDI->expr_).field_2._M_allocated_capacity =
         (in_RDI->expr_).field_2._M_allocated_capacity + 1;
    local_38 = parseValue(in_stack_ffffffffffffffd8);
    break;
  case (ExpressionParser<__int128> *)0x5:
    (in_RDI->expr_).field_2._M_allocated_capacity =
         (in_RDI->expr_).field_2._M_allocated_capacity + 1;
    local_38 = parseValue(in_stack_ffffffffffffffd8);
    local_38 = (__int128 *)-(long)local_38;
    break;
  case (ExpressionParser<__int128> *)0x8:
    bVar2 = isHex(in_stack_fffffffffffffed8);
    if (bVar2) {
      local_38 = parseHex(this_00);
    }
    else {
      local_38 = parseDecimal(this_00);
    }
    break;
  case (ExpressionParser<__int128> *)0x9:
  case (ExpressionParser<__int128> *)0xa:
  case (ExpressionParser<__int128> *)0xb:
  case (ExpressionParser<__int128> *)0xc:
  case (ExpressionParser<__int128> *)0xd:
  case (ExpressionParser<__int128> *)0xe:
  case (ExpressionParser<__int128> *)0xf:
  case (ExpressionParser<__int128> *)0x10:
  case (ExpressionParser<__int128> *)0x11:
    local_38 = parseDecimal(this_00);
    break;
  case (ExpressionParser<__int128> *)0x56:
    (in_RDI->expr_).field_2._M_allocated_capacity =
         (in_RDI->expr_).field_2._M_allocated_capacity + 1;
    local_38 = parseValue(in_stack_ffffffffffffffd8);
    local_38 = (__int128 *)~(ulong)local_38;
  }
  return local_38;
}

Assistant:

T parseValue()
  {
    T val = 0;
    eatSpaces();
    switch (getCharacter())
    {
      case '0': if (isHex())
                  val = parseHex();
                else
                  val = parseDecimal();
                break;
      case '1': case '2': case '3': case '4': case '5':
      case '6': case '7': case '8': case '9':
                val = parseDecimal();
                break;
      case '(': index_++;
                val = parseExpr();
                eatSpaces();
                if (getCharacter() != ')')
                {
                  if (!isEnd())
                    unexpected();
                  throw calculator::error(expr_, "Syntax error: `)' expected at end of expression");
                }
                index_++; break;
      case '~': index_++; val = ~parseValue(); break;
      case '+': index_++; val =  parseValue(); break;
      case '-': index_++; val =  parseValue() * static_cast<T>(-1);
                break;
      default : if (!isEnd())
                  unexpected();
                throw calculator::error(expr_, "Syntax error: value expected at end of expression");
    }
    return val;
  }